

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_sort.cc
# Opt level: O0

void unique_features(features *fs,int max)

{
  undefined8 uVar1;
  bool bVar2;
  size_t a;
  long *plVar3;
  features_value_index_audit_iterator *rhs;
  feature_value *pfVar4;
  char *pcVar5;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int in_ESI;
  features_value_iterator *rhs_00;
  long in_RDI;
  iterator_all i;
  iterator_all end;
  iterator_all last_index;
  features_value_index_audit_range range;
  features *in_stack_ffffffffffffff48;
  features_value_index_audit_iterator *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  feature_value fVar6;
  features_value_index_audit_range *in_stack_ffffffffffffff68;
  long lVar7;
  features_value_iterator in_stack_ffffffffffffff88;
  features *in_stack_ffffffffffffff90;
  features_value_iterator local_48 [3];
  features_value_index_audit_iterator local_30;
  features *local_18;
  int local_c;
  long local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  bVar2 = v_array<unsigned_long>::empty((v_array<unsigned_long> *)(in_RDI + 0x20));
  if (!bVar2) {
    local_18 = (features *)features::values_indices_audit(in_stack_ffffffffffffff48);
    features::features_value_index_audit_range::begin(in_stack_ffffffffffffff68);
    if (local_c < 1) {
      features::features_value_index_audit_range::end(in_stack_ffffffffffffff68);
    }
    else {
      features::features_value_index_audit_range::begin(in_stack_ffffffffffffff68);
      a = features::size((features *)0x40a0e5);
      min(a,(long)local_c);
      features_value_index_audit_iterator::operator+
                ((features_value_index_audit_iterator *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (unsigned_long)in_stack_ffffffffffffff50);
    }
    features::features_value_index_audit_range::begin(in_stack_ffffffffffffff68);
    features_value_index_audit_iterator::operator++(in_stack_ffffffffffffff50);
    features_value_index_audit_iterator::features_value_index_audit_iterator
              (in_stack_ffffffffffffff50,
               (features_value_index_audit_iterator *)in_stack_ffffffffffffff48);
    while( true ) {
      rhs_00 = local_48;
      bVar2 = features_value_iterator::operator!=
                        ((features_value_iterator *)&stack0xffffffffffffff88,rhs_00);
      if (!bVar2) break;
      plVar3 = (long *)features_value_index_iterator::index
                                 ((features_value_index_iterator *)&stack0xffffffffffffff88,
                                  (char *)rhs_00,__c);
      lVar7 = *plVar3;
      plVar3 = (long *)features_value_index_iterator::index
                                 (&local_30.super_features_value_index_iterator,(char *)rhs_00,
                                  __c_00);
      if (lVar7 != *plVar3) {
        rhs = features_value_index_audit_iterator::operator++(in_stack_ffffffffffffff50);
        bVar2 = features_value_iterator::operator!=
                          ((features_value_iterator *)&stack0xffffffffffffff88,
                           (features_value_iterator *)rhs);
        if (bVar2) {
          pfVar4 = features_value_iterator::value
                             ((features_value_iterator *)&stack0xffffffffffffff88);
          fVar6 = *pfVar4;
          pfVar4 = features_value_iterator::value((features_value_iterator *)&local_30);
          *pfVar4 = fVar6;
          pcVar5 = features_value_index_iterator::index
                             ((features_value_index_iterator *)&stack0xffffffffffffff88,(char *)rhs,
                              __c_01);
          uVar1 = *(undefined8 *)pcVar5;
          pcVar5 = features_value_index_iterator::index
                             (&local_30.super_features_value_index_iterator,(char *)rhs,__c_02);
          *(undefined8 *)pcVar5 = uVar1;
          bVar2 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::empty((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(local_8 + 0x40));
          if (!bVar2) {
            in_stack_ffffffffffffff50 =
                 (features_value_index_audit_iterator *)
                 features_value_index_audit_iterator::audit_abi_cxx11_
                           ((features_value_index_audit_iterator *)&stack0xffffffffffffff88);
            features_value_index_audit_iterator::audit_abi_cxx11_(&local_30);
            std::
            shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffff50,
                        (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffff48);
          }
        }
      }
      features_value_index_audit_iterator::operator++(in_stack_ffffffffffffff50);
    }
    features_value_index_audit_iterator::operator++(in_stack_ffffffffffffff50);
    features::truncate_to
              (in_stack_ffffffffffffff90,(features_value_iterator *)in_stack_ffffffffffffff88._begin
              );
  }
  return;
}

Assistant:

void unique_features(features& fs, int max)
{
  if (fs.indicies.empty())
    return;

  features::features_value_index_audit_range range = fs.values_indices_audit();
  features::iterator_all last_index = range.begin();
  features::iterator_all end = max > 0 ? range.begin() + min(fs.size(), (size_t)max) : range.end();

  for (features::iterator_all i = ++range.begin(); i != end; ++i)
    if (i.index() != last_index.index())
      if (i != ++last_index)
      {
        last_index.value() = i.value();
        last_index.index() = i.index();
        if (!fs.space_names.empty())
          last_index.audit() = i.audit();
      }

  ++last_index;
  fs.truncate_to(last_index);
}